

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O2

void aom_highbd_lpf_horizontal_4_dual_sse2
               (uint16_t *s,int p,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0,
               uint8_t *_blimit1,uint8_t *_limit1,uint8_t *_thresh1,int bd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  short sVar8;
  undefined1 auVar9 [16];
  short sVar10;
  ushort uVar11;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  undefined1 auVar12 [16];
  ushort uVar19;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ushort local_178;
  ushort uStack_176;
  ushort uStack_174;
  ushort uStack_172;
  ushort uStack_170;
  ushort uStack_16e;
  ushort uStack_16c;
  ushort uStack_16a;
  longlong local_148;
  longlong lStack_140;
  longlong local_138;
  longlong lStack_130;
  longlong local_128;
  longlong lStack_120;
  longlong local_118;
  longlong lStack_110;
  longlong local_108 [2];
  __m128i thresh0;
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  __m128i limit0;
  __m128i blimit0;
  __m128i qs [2];
  __m128i ps [2];
  __m128i q [2];
  __m128i p_1 [2];
  short sVar20;
  
  auVar1 = *(undefined1 (*) [16])(s + -(long)(p * 2));
  lVar5 = (long)p;
  auVar2 = *(undefined1 (*) [16])(s + -lVar5);
  auVar3 = *(undefined1 (*) [16])s;
  auVar4 = *(undefined1 (*) [16])(s + lVar5);
  auVar6 = psubusw(auVar3,auVar2);
  auVar21 = psubusw(auVar2,auVar3);
  auVar7 = psubusw(auVar4,auVar1);
  auVar22 = psubusw(auVar1,auVar4);
  auVar22 = auVar22 | auVar7;
  auVar7 = psubusw(auVar1,auVar2);
  auVar9 = psubusw(auVar2,auVar1);
  auVar9 = auVar9 | auVar7;
  auVar7 = psubusw(auVar4,auVar3);
  auVar12 = psubusw(auVar3,auVar4);
  auVar12 = auVar12 | auVar7;
  sVar8 = auVar9._0_2_;
  sVar10 = auVar12._0_2_;
  uVar11 = (ushort)(sVar10 < sVar8) * sVar8 | (ushort)(sVar10 >= sVar8) * sVar10;
  sVar8 = auVar9._2_2_;
  sVar10 = auVar12._2_2_;
  uVar13 = (ushort)(sVar10 < sVar8) * sVar8 | (ushort)(sVar10 >= sVar8) * sVar10;
  sVar8 = auVar9._4_2_;
  sVar10 = auVar12._4_2_;
  uVar14 = (ushort)(sVar10 < sVar8) * sVar8 | (ushort)(sVar10 >= sVar8) * sVar10;
  sVar8 = auVar9._6_2_;
  sVar10 = auVar12._6_2_;
  uVar15 = (ushort)(sVar10 < sVar8) * sVar8 | (ushort)(sVar10 >= sVar8) * sVar10;
  sVar8 = auVar9._8_2_;
  sVar10 = auVar12._8_2_;
  uVar16 = (ushort)(sVar10 < sVar8) * sVar8 | (ushort)(sVar10 >= sVar8) * sVar10;
  sVar8 = auVar9._10_2_;
  sVar10 = auVar12._10_2_;
  uVar17 = (ushort)(sVar10 < sVar8) * sVar8 | (ushort)(sVar10 >= sVar8) * sVar10;
  sVar8 = auVar9._12_2_;
  sVar10 = auVar12._12_2_;
  sVar20 = auVar12._14_2_;
  uVar18 = (ushort)(sVar10 < sVar8) * sVar8 | (ushort)(sVar10 >= sVar8) * sVar10;
  sVar8 = auVar9._14_2_;
  uVar19 = (ushort)(sVar20 < sVar8) * sVar8 | (ushort)(sVar20 >= sVar8) * sVar20;
  get_limit_dual(_blimit0,_limit0,_thresh0,_blimit1,_limit1,_thresh1,bd,&blimit0,&limit0,&thresh0,
                 &local_108);
  auVar6 = paddusw(auVar21 | auVar6,auVar21 | auVar6);
  local_178 = auVar22._0_2_;
  uStack_176 = auVar22._2_2_;
  uStack_174 = auVar22._4_2_;
  uStack_172 = auVar22._6_2_;
  uStack_170 = auVar22._8_2_;
  uStack_16e = auVar22._10_2_;
  uStack_16c = auVar22._12_2_;
  uStack_16a = auVar22._14_2_;
  auVar7._0_2_ = local_178 >> 1;
  auVar7._2_2_ = uStack_176 >> 1;
  auVar7._4_2_ = uStack_174 >> 1;
  auVar7._6_2_ = uStack_172 >> 1;
  auVar7._8_2_ = uStack_170 >> 1;
  auVar7._10_2_ = uStack_16e >> 1;
  auVar7._12_2_ = uStack_16c >> 1;
  auVar7._14_2_ = uStack_16a >> 1;
  auVar7 = paddusw(auVar7,auVar6);
  auVar7 = auVar7 ^ _DAT_00434980;
  auVar6 = _DAT_00434980 ^ (undefined1  [16])blimit0;
  auVar9._0_2_ = -(ushort)(auVar6._0_2_ < auVar7._0_2_);
  auVar9._2_2_ = -(ushort)(auVar6._2_2_ < auVar7._2_2_);
  auVar9._4_2_ = -(ushort)(auVar6._4_2_ < auVar7._4_2_);
  auVar9._6_2_ = -(ushort)(auVar6._6_2_ < auVar7._6_2_);
  auVar9._8_2_ = -(ushort)(auVar6._8_2_ < auVar7._8_2_);
  auVar9._10_2_ = -(ushort)(auVar6._10_2_ < auVar7._10_2_);
  auVar9._12_2_ = -(ushort)(auVar6._12_2_ < auVar7._12_2_);
  auVar9._14_2_ = -(ushort)(auVar6._14_2_ < auVar7._14_2_);
  auVar6 = paddusw(_DAT_0046e8b0,(undefined1  [16])limit0);
  auVar6 = auVar6 & auVar9;
  sVar8 = auVar6._0_2_;
  auVar12._0_2_ = (sVar8 < (short)uVar11) * uVar11 | (ushort)(sVar8 >= (short)uVar11) * sVar8;
  sVar8 = auVar6._2_2_;
  auVar12._2_2_ = (sVar8 < (short)uVar13) * uVar13 | (ushort)(sVar8 >= (short)uVar13) * sVar8;
  sVar8 = auVar6._4_2_;
  auVar12._4_2_ = (sVar8 < (short)uVar14) * uVar14 | (ushort)(sVar8 >= (short)uVar14) * sVar8;
  sVar8 = auVar6._6_2_;
  auVar12._6_2_ = (sVar8 < (short)uVar15) * uVar15 | (ushort)(sVar8 >= (short)uVar15) * sVar8;
  sVar8 = auVar6._8_2_;
  auVar12._8_2_ = (sVar8 < (short)uVar16) * uVar16 | (ushort)(sVar8 >= (short)uVar16) * sVar8;
  sVar8 = auVar6._10_2_;
  auVar12._10_2_ = (sVar8 < (short)uVar17) * uVar17 | (ushort)(sVar8 >= (short)uVar17) * sVar8;
  sVar8 = auVar6._12_2_;
  sVar10 = auVar6._14_2_;
  auVar12._12_2_ = (sVar8 < (short)uVar18) * uVar18 | (ushort)(sVar8 >= (short)uVar18) * sVar8;
  auVar12._14_2_ = (sVar10 < (short)uVar19) * uVar19 | (ushort)(sVar10 >= (short)uVar19) * sVar10;
  auVar6 = psubusw(auVar12,(undefined1  [16])limit0);
  local_e8 = -(ushort)(auVar6._0_2_ == 0);
  sStack_e6 = -(ushort)(auVar6._2_2_ == 0);
  sStack_e4 = -(ushort)(auVar6._4_2_ == 0);
  sStack_e2 = -(ushort)(auVar6._6_2_ == 0);
  sStack_e0 = -(ushort)(auVar6._8_2_ == 0);
  sStack_de = -(ushort)(auVar6._10_2_ == 0);
  sStack_dc = -(ushort)(auVar6._12_2_ == 0);
  sStack_da = -(ushort)(auVar6._14_2_ == 0);
  local_128 = auVar2._0_8_;
  lStack_120 = auVar2._8_8_;
  p_1[0][0] = local_128;
  p_1[0][1] = lStack_120;
  local_118 = auVar1._0_8_;
  lStack_110 = auVar1._8_8_;
  p_1[1][0] = local_118;
  p_1[1][1] = lStack_110;
  local_138 = auVar3._0_8_;
  lStack_130 = auVar3._8_8_;
  q[0][0] = local_138;
  q[0][1] = lStack_130;
  local_148 = auVar4._0_8_;
  lStack_140 = auVar4._8_8_;
  q[1][0] = local_148;
  q[1][1] = lStack_140;
  highbd_filter4_dual_sse2(p_1,q,ps,qs,(__m128i *)&local_e8,&thresh0,bd,&local_108);
  *(longlong *)(s + -(long)(p * 2)) = ps[1][0];
  *(longlong *)(s + -(long)(p * 2) + 4) = ps[1][1];
  *(longlong *)(s + -lVar5) = ps[0][0];
  *(longlong *)(s + -lVar5 + 4) = ps[0][1];
  *(longlong *)s = qs[0][0];
  *(longlong *)(s + 4) = qs[0][1];
  *(longlong *)(s + lVar5) = qs[1][0];
  *(longlong *)(s + lVar5 + 4) = qs[1][1];
  return;
}

Assistant:

void aom_highbd_lpf_horizontal_4_dual_sse2(
    uint16_t *s, int p, const uint8_t *_blimit0, const uint8_t *_limit0,
    const uint8_t *_thresh0, const uint8_t *_blimit1, const uint8_t *_limit1,
    const uint8_t *_thresh1, int bd) {
  __m128i p1 = _mm_loadu_si128((__m128i *)(s - 2 * p));
  __m128i p0 = _mm_loadu_si128((__m128i *)(s - 1 * p));
  __m128i q0 = _mm_loadu_si128((__m128i *)(s - 0 * p));
  __m128i q1 = _mm_loadu_si128((__m128i *)(s + 1 * p));
  __m128i ps[2], qs[2];

  highbd_lpf_internal_4_dual_sse2(&p1, &p0, &q0, &q1, ps, qs, _blimit0, _limit0,
                                  _thresh0, _blimit1, _limit1, _thresh1, bd);

  _mm_storeu_si128((__m128i *)(s - 2 * p), ps[1]);
  _mm_storeu_si128((__m128i *)(s - 1 * p), ps[0]);
  _mm_storeu_si128((__m128i *)(s + 0 * p), qs[0]);
  _mm_storeu_si128((__m128i *)(s + 1 * p), qs[1]);
}